

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

string * __thiscall
spvtools::val::ValidationState_t::VkErrorID_abi_cxx11_
          (string *__return_storage_ptr__,ValidationState_t *this,uint32_t id,char *param_2)

{
  bool bVar1;
  char *__s;
  allocator<char> local_11;
  
  bVar1 = spvIsVulkanEnv(this->context_->target_env);
  if (bVar1) {
    switch(id) {
    case 0x103a:
      __s = "[VUID-BaryCoordKHR-BaryCoordKHR-04154] ";
      break;
    case 0x103b:
      __s = "[VUID-BaryCoordKHR-BaryCoordKHR-04155] ";
      break;
    case 0x103c:
      __s = "[VUID-BaryCoordKHR-BaryCoordKHR-04156] ";
      break;
    case 0x103d:
    case 0x103e:
    case 0x103f:
    case 0x1043:
    case 0x1044:
    case 0x1045:
    case 0x1046:
    case 0x1047:
    case 0x1048:
    case 0x1049:
    case 0x104a:
    case 0x104b:
    case 0x104c:
    case 0x104d:
    case 0x104e:
    case 0x104f:
    case 0x1050:
    case 0x1051:
    case 0x1052:
    case 0x1053:
    case 0x1054:
    case 0x1060:
    case 0x1061:
    case 0x1062:
    case 0x1063:
    case 0x1069:
    case 0x106a:
    case 0x106b:
    case 0x106c:
    case 0x1082:
    case 0x1083:
    case 0x1084:
    case 0x108b:
    case 0x10a4:
    case 0x10a5:
    case 0x10a6:
    case 0x10b5:
    case 0x10b6:
    case 0x10b7:
    case 0x10b8:
    case 0x10bc:
    case 0x10bd:
    case 0x10be:
    case 0x10bf:
    case 0x10c0:
    case 0x10c1:
    case 0x10c2:
    case 0x10c3:
    case 0x10c4:
    case 0x10e2:
    case 0x10e3:
    case 0x10e4:
    case 0x10e5:
    case 0x10e6:
    case 0x10e7:
    case 0x10e8:
    case 0x10e9:
    case 0x10eb:
    case 0x10ec:
    case 0x10ed:
    case 0x10ef:
    case 0x10f0:
    case 0x10f2:
    case 0x10f3:
    case 0x10f4:
    case 0x10f5:
    case 0x10f6:
    case 0x10f7:
    case 0x10f8:
    case 0x110b:
    case 0x110c:
    case 0x110d:
    case 0x110e:
    case 0x1120:
    case 0x1121:
    case 0x1122:
    case 0x1139:
    case 0x113a:
    case 0x113b:
    case 0x113c:
    case 0x113d:
    case 0x113e:
    case 0x113f:
    case 0x1140:
    case 0x1141:
    case 0x1142:
    case 0x1143:
    case 0x1144:
    case 0x1145:
    case 0x1155:
    case 0x1156:
    case 0x1157:
    case 0x1158:
    case 0x1159:
    case 0x115a:
    case 0x115b:
    case 0x115c:
    case 0x115d:
    case 0x115e:
    case 0x115f:
    case 0x1160:
    case 0x1161:
    case 0x1162:
    case 0x1163:
    case 0x1164:
    case 0x1165:
    case 0x1166:
    case 0x1167:
    case 0x1168:
    case 0x1169:
    case 0x116a:
    case 0x116b:
    case 0x116c:
    case 0x116d:
    case 0x116e:
    case 0x116f:
    case 0x1170:
    case 0x1171:
    case 0x1172:
    case 0x1173:
    case 0x1174:
    case 0x1175:
    case 0x1176:
    case 0x1177:
    case 0x1178:
    case 0x1179:
    case 0x117a:
    case 0x117b:
    case 0x117c:
    case 0x117d:
    case 0x117e:
    case 0x117f:
    case 0x1180:
    case 0x1181:
    case 0x1182:
    case 0x1183:
    case 0x1187:
    case 0x1188:
    case 0x1189:
    case 0x118d:
    case 0x118e:
    case 0x118f:
    case 0x1190:
    case 0x1191:
    case 0x1192:
    case 0x1193:
    case 0x1194:
    case 0x1195:
    case 0x1196:
    case 0x1197:
    case 0x1198:
    case 0x1199:
    case 0x119a:
    case 0x119b:
    case 0x119c:
    case 0x119d:
    case 0x119e:
    case 0x119f:
    case 0x11a0:
    case 0x11a1:
    case 0x11a2:
    case 0x11a3:
    case 0x11a4:
    case 0x11a5:
    case 0x11a6:
    case 0x11a7:
    case 0x11a8:
    case 0x11a9:
    case 0x11aa:
    case 0x11ab:
    case 0x11ac:
    case 0x11ad:
    case 0x11ae:
    case 0x11af:
    case 0x11b0:
    case 0x11b1:
    case 0x11b2:
    case 0x11b3:
    case 0x11b4:
    case 0x11b5:
    case 0x11b6:
    case 0x11b7:
    case 0x11b8:
    case 0x11b9:
    case 0x11ba:
    case 0x11bb:
    case 0x11bc:
    case 0x11bd:
    case 0x11be:
    case 0x11bf:
    case 0x11c0:
    case 0x11c1:
    case 0x11c2:
    case 0x11c3:
    case 0x11c4:
    case 0x11c5:
    case 0x11c6:
    case 0x11c7:
    case 0x11c8:
    case 0x11c9:
    case 0x11ca:
    case 0x11cb:
    case 0x11cc:
    case 0x11cd:
    case 0x11ce:
    case 0x11cf:
    case 0x11d0:
    case 0x11d1:
    case 0x11d2:
    case 0x11d3:
    case 0x11d4:
    case 0x11d5:
    case 0x11d6:
    case 0x11d7:
    case 0x11d8:
    case 0x11d9:
    case 0x11da:
    case 0x11db:
    case 0x11dc:
    case 0x11dd:
    case 0x11de:
    case 0x11df:
    case 0x11e0:
    case 0x11e1:
    case 0x11e2:
    case 0x11e3:
    case 0x11e4:
    case 0x11e5:
    case 0x11e6:
    case 0x11e7:
    case 0x11e8:
    case 0x11e9:
    case 0x11ea:
    case 0x11eb:
    case 0x11ec:
    case 0x11ed:
    case 0x11ee:
    case 0x11ef:
    case 0x11f0:
    case 0x11f1:
    case 0x11f2:
    case 0x11f3:
    case 0x11f4:
    case 0x11f5:
    case 0x11f6:
    case 0x11f7:
    case 0x11f8:
    case 0x11f9:
    case 0x11fa:
    case 0x11fb:
    case 0x11fc:
    case 0x11fd:
    case 0x11fe:
    case 0x11ff:
    case 0x1200:
    case 0x1201:
    case 0x1202:
    case 0x1203:
    case 0x1204:
    case 0x1205:
    case 0x1206:
    case 0x1207:
    case 0x1208:
    case 0x1209:
    case 0x120a:
    case 0x120b:
    case 0x120c:
    case 0x120d:
    case 0x120e:
    case 0x120f:
    case 0x1210:
    case 0x1211:
    case 0x1212:
    case 0x1213:
    case 0x1214:
    case 0x1215:
    case 0x1216:
    case 0x1217:
    case 0x1218:
    case 0x121f:
    case 0x1226:
    case 0x1227:
    case 0x1228:
    case 0x1229:
    case 0x1234:
    case 0x1235:
    case 0x1236:
    case 0x1239:
    case 0x123a:
    case 0x123c:
    case 0x123f:
    case 0x1240:
    case 0x1241:
    case 0x1242:
    case 0x1244:
    case 0x1246:
    case 0x1247:
    case 0x1249:
    case 0x124b:
    case 0x124c:
    case 0x124f:
    case 0x1250:
    case 0x1251:
    case 0x1252:
    case 0x1253:
    case 0x1254:
    case 0x1255:
    case 0x1256:
    case 0x1257:
    case 0x1258:
    case 0x1259:
    case 0x1263:
    case 0x1265:
    case 0x1268:
    case 0x1269:
    case 0x126a:
    case 0x126b:
    case 0x126c:
    case 0x126d:
    case 0x126e:
    case 0x126f:
    case 0x1270:
    case 0x1271:
    case 0x1272:
    case 0x1273:
    case 0x1274:
    case 0x1275:
    case 0x1276:
    case 0x1277:
    case 0x1278:
    case 0x1279:
    case 0x127f:
    case 0x1280:
    case 0x1281:
    case 0x1282:
    case 0x1283:
    case 0x1284:
    case 0x1285:
    case 0x1286:
    case 0x1287:
    case 0x1289:
    case 0x128a:
    case 0x128b:
    case 0x128c:
    case 0x128d:
    case 0x128e:
    case 0x128f:
    case 0x1290:
    case 0x1291:
    case 0x1292:
    case 0x1293:
    case 0x1294:
    case 0x1295:
    case 0x1296:
    case 0x1297:
    case 0x1298:
    case 0x1299:
    case 0x129a:
    case 0x129b:
    case 0x129c:
    case 0x129d:
    case 0x129e:
    case 0x129f:
    case 0x12a0:
    case 0x12a1:
    case 0x12a2:
    case 0x12a3:
    case 0x12a4:
    case 0x12a5:
    case 0x12a6:
    case 0x12a7:
    case 0x12a8:
    case 0x12aa:
    case 0x12ab:
      goto switchD_00190848_caseD_103d;
    case 0x1040:
      __s = "[VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04160] ";
      break;
    case 0x1041:
      __s = "[VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04161] ";
      break;
    case 0x1042:
      __s = "[VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04162] ";
      break;
    case 0x1055:
      __s = "[VUID-BaseInstance-BaseInstance-04181] ";
      break;
    case 0x1056:
      __s = "[VUID-BaseInstance-BaseInstance-04182] ";
      break;
    case 0x1057:
      __s = "[VUID-BaseInstance-BaseInstance-04183] ";
      break;
    case 0x1058:
      __s = "[VUID-BaseVertex-BaseVertex-04184] ";
      break;
    case 0x1059:
      __s = "[VUID-BaseVertex-BaseVertex-04185] ";
      break;
    case 0x105a:
      __s = "[VUID-BaseVertex-BaseVertex-04186] ";
      break;
    case 0x105b:
      __s = "[VUID-ClipDistance-ClipDistance-04187] ";
      break;
    case 0x105c:
      __s = "[VUID-ClipDistance-ClipDistance-04188] ";
      break;
    case 0x105d:
      __s = "[VUID-ClipDistance-ClipDistance-04189] ";
      break;
    case 0x105e:
      __s = "[VUID-ClipDistance-ClipDistance-04190] ";
      break;
    case 0x105f:
      __s = "[VUID-ClipDistance-ClipDistance-04191] ";
      break;
    case 0x1064:
      __s = "[VUID-CullDistance-CullDistance-04196] ";
      break;
    case 0x1065:
      __s = "[VUID-CullDistance-CullDistance-04197] ";
      break;
    case 0x1066:
      __s = "[VUID-CullDistance-CullDistance-04198] ";
      break;
    case 0x1067:
      __s = "[VUID-CullDistance-CullDistance-04199] ";
      break;
    case 0x1068:
      __s = "[VUID-CullDistance-CullDistance-04200] ";
      break;
    case 0x106d:
      __s = "[VUID-DeviceIndex-DeviceIndex-04205] ";
      break;
    case 0x106e:
      __s = "[VUID-DeviceIndex-DeviceIndex-04206] ";
      break;
    case 0x106f:
      __s = "[VUID-DrawIndex-DrawIndex-04207] ";
      break;
    case 0x1070:
      __s = "[VUID-DrawIndex-DrawIndex-04208] ";
      break;
    case 0x1071:
      __s = "[VUID-DrawIndex-DrawIndex-04209] ";
      break;
    case 0x1072:
      __s = "[VUID-FragCoord-FragCoord-04210] ";
      break;
    case 0x1073:
      __s = "[VUID-FragCoord-FragCoord-04211] ";
      break;
    case 0x1074:
      __s = "[VUID-FragCoord-FragCoord-04212] ";
      break;
    case 0x1075:
      __s = "[VUID-FragDepth-FragDepth-04213] ";
      break;
    case 0x1076:
      __s = "[VUID-FragDepth-FragDepth-04214] ";
      break;
    case 0x1077:
      __s = "[VUID-FragDepth-FragDepth-04215] ";
      break;
    case 0x1078:
      __s = "[VUID-FragDepth-FragDepth-04216] ";
      break;
    case 0x1079:
      __s = "[VUID-FragInvocationCountEXT-FragInvocationCountEXT-04217] ";
      break;
    case 0x107a:
      __s = "[VUID-FragInvocationCountEXT-FragInvocationCountEXT-04218] ";
      break;
    case 0x107b:
      __s = "[VUID-FragInvocationCountEXT-FragInvocationCountEXT-04219] ";
      break;
    case 0x107c:
      __s = "[VUID-FragSizeEXT-FragSizeEXT-04220] ";
      break;
    case 0x107d:
      __s = "[VUID-FragSizeEXT-FragSizeEXT-04221] ";
      break;
    case 0x107e:
      __s = "[VUID-FragSizeEXT-FragSizeEXT-04222] ";
      break;
    case 0x107f:
      __s = "[VUID-FragStencilRefEXT-FragStencilRefEXT-04223] ";
      break;
    case 0x1080:
      __s = "[VUID-FragStencilRefEXT-FragStencilRefEXT-04224] ";
      break;
    case 0x1081:
      __s = "[VUID-FragStencilRefEXT-FragStencilRefEXT-04225] ";
      break;
    case 0x1085:
      __s = "[VUID-FrontFacing-FrontFacing-04229] ";
      break;
    case 0x1086:
      __s = "[VUID-FrontFacing-FrontFacing-04230] ";
      break;
    case 0x1087:
      __s = "[VUID-FrontFacing-FrontFacing-04231] ";
      break;
    case 0x1088:
      __s = "[VUID-FullyCoveredEXT-FullyCoveredEXT-04232] ";
      break;
    case 0x1089:
      __s = "[VUID-FullyCoveredEXT-FullyCoveredEXT-04233] ";
      break;
    case 0x108a:
      __s = "[VUID-FullyCoveredEXT-FullyCoveredEXT-04234] ";
      break;
    case 0x108c:
      __s = "[VUID-GlobalInvocationId-GlobalInvocationId-04236] ";
      break;
    case 0x108d:
      __s = "[VUID-GlobalInvocationId-GlobalInvocationId-04237] ";
      break;
    case 0x108e:
      __s = "[VUID-GlobalInvocationId-GlobalInvocationId-04238] ";
      break;
    case 0x108f:
      __s = "[VUID-HelperInvocation-HelperInvocation-04239] ";
      break;
    case 0x1090:
      __s = "[VUID-HelperInvocation-HelperInvocation-04240] ";
      break;
    case 0x1091:
      __s = "[VUID-HelperInvocation-HelperInvocation-04241] ";
      break;
    case 0x1092:
      __s = "[VUID-HitKindKHR-HitKindKHR-04242] ";
      break;
    case 0x1093:
      __s = "[VUID-HitKindKHR-HitKindKHR-04243] ";
      break;
    case 0x1094:
      __s = "[VUID-HitKindKHR-HitKindKHR-04244] ";
      break;
    case 0x1095:
      __s = "[VUID-HitTNV-HitTNV-04245] ";
      break;
    case 0x1096:
      __s = "[VUID-HitTNV-HitTNV-04246] ";
      break;
    case 0x1097:
      __s = "[VUID-HitTNV-HitTNV-04247] ";
      break;
    case 0x1098:
      __s = "[VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04248] ";
      break;
    case 0x1099:
      __s = "[VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04249] ";
      break;
    case 0x109a:
      __s = "[VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04250] ";
      break;
    case 0x109b:
      __s = "[VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04251] ";
      break;
    case 0x109c:
      __s = "[VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04252] ";
      break;
    case 0x109d:
      __s = "[VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04253] ";
      break;
    case 0x109e:
      __s = "[VUID-InstanceId-InstanceId-04254] ";
      break;
    case 0x109f:
      __s = "[VUID-InstanceId-InstanceId-04255] ";
      break;
    case 0x10a0:
      __s = "[VUID-InstanceId-InstanceId-04256] ";
      break;
    case 0x10a1:
      __s = "[VUID-InvocationId-InvocationId-04257] ";
      break;
    case 0x10a2:
      __s = "[VUID-InvocationId-InvocationId-04258] ";
      break;
    case 0x10a3:
      __s = "[VUID-InvocationId-InvocationId-04259] ";
      break;
    case 0x10a7:
      __s = "[VUID-InstanceIndex-InstanceIndex-04263] ";
      break;
    case 0x10a8:
      __s = "[VUID-InstanceIndex-InstanceIndex-04264] ";
      break;
    case 0x10a9:
      __s = "[VUID-InstanceIndex-InstanceIndex-04265] ";
      break;
    case 0x10aa:
      __s = "[VUID-LaunchIdKHR-LaunchIdKHR-04266] ";
      break;
    case 0x10ab:
      __s = "[VUID-LaunchIdKHR-LaunchIdKHR-04267] ";
      break;
    case 0x10ac:
      __s = "[VUID-LaunchIdKHR-LaunchIdKHR-04268] ";
      break;
    case 0x10ad:
      __s = "[VUID-LaunchSizeKHR-LaunchSizeKHR-04269] ";
      break;
    case 0x10ae:
      __s = "[VUID-LaunchSizeKHR-LaunchSizeKHR-04270] ";
      break;
    case 0x10af:
      __s = "[VUID-LaunchSizeKHR-LaunchSizeKHR-04271] ";
      break;
    case 0x10b0:
      __s = "[VUID-Layer-Layer-04272] ";
      break;
    case 0x10b1:
      __s = "[VUID-Layer-Layer-04273] ";
      break;
    case 0x10b2:
      __s = "[VUID-Layer-Layer-04274] ";
      break;
    case 0x10b3:
      __s = "[VUID-Layer-Layer-04275] ";
      break;
    case 0x10b4:
      __s = "[VUID-Layer-Layer-04276] ";
      break;
    case 0x10b9:
      __s = "[VUID-LocalInvocationId-LocalInvocationId-04281] ";
      break;
    case 0x10ba:
      __s = "[VUID-LocalInvocationId-LocalInvocationId-04282] ";
      break;
    case 0x10bb:
      __s = "[VUID-LocalInvocationId-LocalInvocationId-04283] ";
      break;
    case 0x10c5:
      __s = "[VUID-NumSubgroups-NumSubgroups-04293] ";
      break;
    case 0x10c6:
      __s = "[VUID-NumSubgroups-NumSubgroups-04294] ";
      break;
    case 0x10c7:
      __s = "[VUID-NumSubgroups-NumSubgroups-04295] ";
      break;
    case 0x10c8:
      __s = "[VUID-NumWorkgroups-NumWorkgroups-04296] ";
      break;
    case 0x10c9:
      __s = "[VUID-NumWorkgroups-NumWorkgroups-04297] ";
      break;
    case 0x10ca:
      __s = "[VUID-NumWorkgroups-NumWorkgroups-04298] ";
      break;
    case 0x10cb:
      __s = "[VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04299] ";
      break;
    case 0x10cc:
      __s = "[VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04300] ";
      break;
    case 0x10cd:
      __s = "[VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04301] ";
      break;
    case 0x10ce:
      __s = "[VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04302] ";
      break;
    case 0x10cf:
      __s = "[VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04303] ";
      break;
    case 0x10d0:
      __s = "[VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04304] ";
      break;
    case 0x10d1:
      __s = "[VUID-ObjectToWorldKHR-ObjectToWorldKHR-04305] ";
      break;
    case 0x10d2:
      __s = "[VUID-ObjectToWorldKHR-ObjectToWorldKHR-04306] ";
      break;
    case 0x10d3:
      __s = "[VUID-ObjectToWorldKHR-ObjectToWorldKHR-04307] ";
      break;
    case 0x10d4:
      __s = "[VUID-PatchVertices-PatchVertices-04308] ";
      break;
    case 0x10d5:
      __s = "[VUID-PatchVertices-PatchVertices-04309] ";
      break;
    case 0x10d6:
      __s = "[VUID-PatchVertices-PatchVertices-04310] ";
      break;
    case 0x10d7:
      __s = "[VUID-PointCoord-PointCoord-04311] ";
      break;
    case 0x10d8:
      __s = "[VUID-PointCoord-PointCoord-04312] ";
      break;
    case 0x10d9:
      __s = "[VUID-PointCoord-PointCoord-04313] ";
      break;
    case 0x10da:
      __s = "[VUID-PointSize-PointSize-04314] ";
      break;
    case 0x10db:
      __s = "[VUID-PointSize-PointSize-04315] ";
      break;
    case 0x10dc:
      __s = "[VUID-PointSize-PointSize-04316] ";
      break;
    case 0x10dd:
      __s = "[VUID-PointSize-PointSize-04317] ";
      break;
    case 0x10de:
      __s = "[VUID-Position-Position-04318] ";
      break;
    case 0x10df:
      __s = "[VUID-Position-Position-04319] ";
      break;
    case 0x10e0:
      __s = "[VUID-Position-Position-04320] ";
      break;
    case 0x10e1:
      __s = "[VUID-Position-Position-04321] ";
      break;
    case 0x10ea:
      __s = "[VUID-PrimitiveId-PrimitiveId-04330] ";
      break;
    case 0x10ee:
      __s = "[VUID-PrimitiveId-PrimitiveId-04334] ";
      break;
    case 0x10f1:
      __s = "[VUID-PrimitiveId-PrimitiveId-04337] ";
      break;
    case 0x10f9:
      __s = "[VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04345] ";
      break;
    case 0x10fa:
      __s = "[VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04346] ";
      break;
    case 0x10fb:
      __s = "[VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04347] ";
      break;
    case 0x10fc:
      __s = "[VUID-RayTmaxKHR-RayTmaxKHR-04348] ";
      break;
    case 0x10fd:
      __s = "[VUID-RayTmaxKHR-RayTmaxKHR-04349] ";
      break;
    case 0x10fe:
      __s = "[VUID-RayTmaxKHR-RayTmaxKHR-04350] ";
      break;
    case 0x10ff:
      __s = "[VUID-RayTminKHR-RayTminKHR-04351] ";
      break;
    case 0x1100:
      __s = "[VUID-RayTminKHR-RayTminKHR-04352] ";
      break;
    case 0x1101:
      __s = "[VUID-RayTminKHR-RayTminKHR-04353] ";
      break;
    case 0x1102:
      __s = "[VUID-SampleId-SampleId-04354] ";
      break;
    case 0x1103:
      __s = "[VUID-SampleId-SampleId-04355] ";
      break;
    case 0x1104:
      __s = "[VUID-SampleId-SampleId-04356] ";
      break;
    case 0x1105:
      __s = "[VUID-SampleMask-SampleMask-04357] ";
      break;
    case 0x1106:
      __s = "[VUID-SampleMask-SampleMask-04358] ";
      break;
    case 0x1107:
      __s = "[VUID-SampleMask-SampleMask-04359] ";
      break;
    case 0x1108:
      __s = "[VUID-SamplePosition-SamplePosition-04360] ";
      break;
    case 0x1109:
      __s = "[VUID-SamplePosition-SamplePosition-04361] ";
      break;
    case 0x110a:
      __s = "[VUID-SamplePosition-SamplePosition-04362] ";
      break;
    case 0x110f:
      __s = "[VUID-SubgroupId-SubgroupId-04367] ";
      break;
    case 0x1110:
      __s = "[VUID-SubgroupId-SubgroupId-04368] ";
      break;
    case 0x1111:
      __s = "[VUID-SubgroupId-SubgroupId-04369] ";
      break;
    case 0x1112:
      __s = "[VUID-SubgroupEqMask-SubgroupEqMask-04370] ";
      break;
    case 0x1113:
      __s = "[VUID-SubgroupEqMask-SubgroupEqMask-04371] ";
      break;
    case 0x1114:
      __s = "[VUID-SubgroupGeMask-SubgroupGeMask-04372] ";
      break;
    case 0x1115:
      __s = "[VUID-SubgroupGeMask-SubgroupGeMask-04373] ";
      break;
    case 0x1116:
      __s = "[VUID-SubgroupGtMask-SubgroupGtMask-04374] ";
      break;
    case 0x1117:
      __s = "[VUID-SubgroupGtMask-SubgroupGtMask-04375] ";
      break;
    case 0x1118:
      __s = "[VUID-SubgroupLeMask-SubgroupLeMask-04376] ";
      break;
    case 0x1119:
      __s = "[VUID-SubgroupLeMask-SubgroupLeMask-04377] ";
      break;
    case 0x111a:
      __s = "[VUID-SubgroupLtMask-SubgroupLtMask-04378] ";
      break;
    case 0x111b:
      __s = "[VUID-SubgroupLtMask-SubgroupLtMask-04379] ";
      break;
    case 0x111c:
      __s = "[VUID-SubgroupLocalInvocationId-SubgroupLocalInvocationId-04380] ";
      break;
    case 0x111d:
      __s = "[VUID-SubgroupLocalInvocationId-SubgroupLocalInvocationId-04381] ";
      break;
    case 0x111e:
      __s = "[VUID-SubgroupSize-SubgroupSize-04382] ";
      break;
    case 0x111f:
      __s = "[VUID-SubgroupSize-SubgroupSize-04383] ";
      break;
    case 0x1123:
      __s = "[VUID-TessCoord-TessCoord-04387] ";
      break;
    case 0x1124:
      __s = "[VUID-TessCoord-TessCoord-04388] ";
      break;
    case 0x1125:
      __s = "[VUID-TessCoord-TessCoord-04389] ";
      break;
    case 0x1126:
      __s = "[VUID-TessLevelOuter-TessLevelOuter-04390] ";
      break;
    case 0x1127:
      __s = "[VUID-TessLevelOuter-TessLevelOuter-04391] ";
      break;
    case 0x1128:
      __s = "[VUID-TessLevelOuter-TessLevelOuter-04392] ";
      break;
    case 0x1129:
      __s = "[VUID-TessLevelOuter-TessLevelOuter-04393] ";
      break;
    case 0x112a:
      __s = "[VUID-TessLevelInner-TessLevelInner-04394] ";
      break;
    case 0x112b:
      __s = "[VUID-TessLevelInner-TessLevelInner-04395] ";
      break;
    case 0x112c:
      __s = "[VUID-TessLevelInner-TessLevelInner-04396] ";
      break;
    case 0x112d:
      __s = "[VUID-TessLevelInner-TessLevelInner-04397] ";
      break;
    case 0x112e:
      __s = "[VUID-VertexIndex-VertexIndex-04398] ";
      break;
    case 0x112f:
      __s = "[VUID-VertexIndex-VertexIndex-04399] ";
      break;
    case 0x1130:
      __s = "[VUID-VertexIndex-VertexIndex-04400] ";
      break;
    case 0x1131:
      __s = "[VUID-ViewIndex-ViewIndex-04401] ";
      break;
    case 0x1132:
      __s = "[VUID-ViewIndex-ViewIndex-04402] ";
      break;
    case 0x1133:
      __s = "[VUID-ViewIndex-ViewIndex-04403] ";
      break;
    case 0x1134:
      __s = "[VUID-ViewportIndex-ViewportIndex-04404] ";
      break;
    case 0x1135:
      __s = "[VUID-ViewportIndex-ViewportIndex-04405] ";
      break;
    case 0x1136:
      __s = "[VUID-ViewportIndex-ViewportIndex-04406] ";
      break;
    case 0x1137:
      __s = "[VUID-ViewportIndex-ViewportIndex-04407] ";
      break;
    case 0x1138:
      __s = "[VUID-ViewportIndex-ViewportIndex-04408] ";
      break;
    case 0x1146:
      __s = "[VUID-WorkgroupId-WorkgroupId-04422] ";
      break;
    case 0x1147:
      __s = "[VUID-WorkgroupId-WorkgroupId-04423] ";
      break;
    case 0x1148:
      __s = "[VUID-WorkgroupId-WorkgroupId-04424] ";
      break;
    case 0x1149:
      __s = "[VUID-WorkgroupSize-WorkgroupSize-04425] ";
      break;
    case 0x114a:
      __s = "[VUID-WorkgroupSize-WorkgroupSize-04426] ";
      break;
    case 0x114b:
      __s = "[VUID-WorkgroupSize-WorkgroupSize-04427] ";
      break;
    case 0x114c:
      __s = "[VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04428] ";
      break;
    case 0x114d:
      __s = "[VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04429] ";
      break;
    case 0x114e:
      __s = "[VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04430] ";
      break;
    case 0x114f:
      __s = "[VUID-WorldRayOriginKHR-WorldRayOriginKHR-04431] ";
      break;
    case 0x1150:
      __s = "[VUID-WorldRayOriginKHR-WorldRayOriginKHR-04432] ";
      break;
    case 0x1151:
      __s = "[VUID-WorldRayOriginKHR-WorldRayOriginKHR-04433] ";
      break;
    case 0x1152:
      __s = "[VUID-WorldToObjectKHR-WorldToObjectKHR-04434] ";
      break;
    case 0x1153:
      __s = "[VUID-WorldToObjectKHR-WorldToObjectKHR-04435] ";
      break;
    case 0x1154:
      __s = "[VUID-WorldToObjectKHR-WorldToObjectKHR-04436] ";
      break;
    case 0x1184:
      __s = "[VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04484] ";
      break;
    case 0x1185:
      __s = "[VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04485] ";
      break;
    case 0x1186:
      __s = "[VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04486] ";
      break;
    case 0x118a:
      __s = "[VUID-ShadingRateKHR-ShadingRateKHR-04490] ";
      break;
    case 0x118b:
      __s = "[VUID-ShadingRateKHR-ShadingRateKHR-04491] ";
      break;
    case 0x118c:
      __s = "[VUID-ShadingRateKHR-ShadingRateKHR-04492] ";
      break;
    case 0x1219:
      __s = "[VUID-StandaloneSpirv-None-04633] ";
      break;
    case 0x121a:
      __s = "[VUID-StandaloneSpirv-None-04634] ";
      break;
    case 0x121b:
      __s = "[VUID-StandaloneSpirv-None-04635] ";
      break;
    case 0x121c:
      __s = "[VUID-StandaloneSpirv-None-04636] ";
      break;
    case 0x121d:
      __s = "[VUID-StandaloneSpirv-None-04637] ";
      break;
    case 0x121e:
      __s = "[VUID-StandaloneSpirv-None-04638] ";
      break;
    case 0x1220:
      __s = "[VUID-StandaloneSpirv-None-04640] ";
      break;
    case 0x1221:
      __s = "[VUID-StandaloneSpirv-None-04641] ";
      break;
    case 0x1222:
      __s = "[VUID-StandaloneSpirv-None-04642] ";
      break;
    case 0x1223:
      __s = "[VUID-StandaloneSpirv-None-04643] ";
      break;
    case 0x1224:
      __s = "[VUID-StandaloneSpirv-None-04644] ";
      break;
    case 0x1225:
      __s = "[VUID-StandaloneSpirv-None-04645] ";
      break;
    case 0x122a:
      __s = "[VUID-StandaloneSpirv-OpControlBarrier-04650] ";
      break;
    case 0x122b:
      __s = "[VUID-StandaloneSpirv-OpVariable-04651] ";
      break;
    case 0x122c:
      __s = "[VUID-StandaloneSpirv-OpReadClockKHR-04652] ";
      break;
    case 0x122d:
      __s = "[VUID-StandaloneSpirv-OriginLowerLeft-04653] ";
      break;
    case 0x122e:
      __s = "[VUID-StandaloneSpirv-PixelCenterInteger-04654] ";
      break;
    case 0x122f:
      __s = "[VUID-StandaloneSpirv-UniformConstant-04655] ";
      break;
    case 0x1230:
      __s = "[VUID-StandaloneSpirv-OpTypeImage-04656] ";
      break;
    case 0x1231:
      __s = "[VUID-StandaloneSpirv-OpTypeImage-04657] ";
      break;
    case 0x1232:
      __s = "[VUID-StandaloneSpirv-OpImageTexelPointer-04658] ";
      break;
    case 0x1233:
      __s = "[VUID-StandaloneSpirv-OpImageQuerySizeLod-04659] ";
      break;
    case 0x1237:
      __s = "[VUID-StandaloneSpirv-Offset-04663] ";
      break;
    case 0x1238:
      __s = "[VUID-StandaloneSpirv-OpImageGather-04664] ";
      break;
    case 0x123b:
      __s = "[VUID-StandaloneSpirv-None-04667] ";
      break;
    case 0x123d:
      __s = "[VUID-StandaloneSpirv-GLSLShared-04669] ";
      break;
    case 0x123e:
      __s = "[VUID-StandaloneSpirv-Flat-04670] ";
      break;
    case 0x1243:
      __s = "[VUID-StandaloneSpirv-FPRoundingMode-04675] ";
      break;
    case 0x1245:
      __s = "[VUID-StandaloneSpirv-Invariant-04677] ";
      break;
    case 0x1248:
      __s = "[VUID-StandaloneSpirv-OpTypeRuntimeArray-04680] ";
      break;
    case 0x124a:
      __s = "[VUID-StandaloneSpirv-OpControlBarrier-04682] ";
      break;
    case 0x124d:
      __s = "[VUID-StandaloneSpirv-OpGroupNonUniformBallotBitCount-04685] ";
      break;
    case 0x124e:
      __s = "[VUID-StandaloneSpirv-None-04686] ";
      break;
    case 0x125a:
      __s = "[VUID-StandaloneSpirv-RayPayloadKHR-04698] ";
      break;
    case 0x125b:
      __s = "[VUID-StandaloneSpirv-IncomingRayPayloadKHR-04699] ";
      break;
    case 0x125c:
      __s = "[VUID-StandaloneSpirv-IncomingRayPayloadKHR-04700] ";
      break;
    case 0x125d:
      __s = "[VUID-StandaloneSpirv-HitAttributeKHR-04701] ";
      break;
    case 0x125e:
      __s = "[VUID-StandaloneSpirv-HitAttributeKHR-04702] ";
      break;
    case 0x125f:
      __s = "[VUID-StandaloneSpirv-HitAttributeKHR-04703] ";
      break;
    case 0x1260:
      __s = "[VUID-StandaloneSpirv-CallableDataKHR-04704] ";
      break;
    case 0x1261:
      __s = "[VUID-StandaloneSpirv-IncomingCallableDataKHR-04705] ";
      break;
    case 0x1262:
      __s = "[VUID-StandaloneSpirv-IncomingCallableDataKHR-04706] ";
      break;
    case 0x1264:
      __s = "[VUID-StandaloneSpirv-PhysicalStorageBuffer64-04708] ";
      break;
    case 0x1266:
      __s = "[VUID-StandaloneSpirv-PhysicalStorageBuffer64-04710] ";
      break;
    case 0x1267:
      __s = "[VUID-StandaloneSpirv-OpTypeForwardPointer-04711] ";
      break;
    case 0x127a:
      __s = "[VUID-StandaloneSpirv-OpAtomicStore-04730] ";
      break;
    case 0x127b:
      __s = "[VUID-StandaloneSpirv-OpAtomicLoad-04731] ";
      break;
    case 0x127c:
      __s = "[VUID-StandaloneSpirv-OpMemoryBarrier-04732] ";
      break;
    case 0x127d:
      __s = "[VUID-StandaloneSpirv-OpMemoryBarrier-04733] ";
      break;
    case 0x127e:
      __s = "[VUID-StandaloneSpirv-OpVariable-04734] ";
      break;
    case 0x1288:
      __s = "[VUID-StandaloneSpirv-Flat-04744] ";
      break;
    case 0x12a9:
      __s = "[VUID-StandaloneSpirv-OpImage-04777] ";
      break;
    case 0x12ac:
      __s = "[VUID-StandaloneSpirv-Result-04780] ";
      break;
    case 0x12ad:
      __s = "[VUID-StandaloneSpirv-Base-04781] ";
      break;
    default:
      switch(id) {
      case 0x1333:
        __s = "[VUID-StandaloneSpirv-Location-04915] ";
        break;
      case 0x1334:
        __s = "[VUID-StandaloneSpirv-Location-04916] ";
        break;
      case 0x1335:
        __s = "[VUID-StandaloneSpirv-Location-04917] ";
        break;
      case 0x1336:
        __s = "[VUID-StandaloneSpirv-Location-04918] ";
        break;
      case 0x1337:
        __s = "[VUID-StandaloneSpirv-Location-04919] ";
        break;
      case 0x1338:
        __s = "[VUID-StandaloneSpirv-Component-04920] ";
        break;
      case 0x1339:
        __s = "[VUID-StandaloneSpirv-Component-04921] ";
        break;
      case 0x133a:
        __s = "[VUID-StandaloneSpirv-Component-04922] ";
        break;
      case 0x133b:
        __s = "[VUID-StandaloneSpirv-Component-04923] ";
        break;
      case 0x133c:
        __s = "[VUID-StandaloneSpirv-Component-04924] ";
        break;
      default:
        switch(id) {
        case 0x1b81:
          __s = "[VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07041] ";
          break;
        case 0x1b82:
        case 0x1b85:
        case 0x1b86:
        case 0x1b88:
        case 0x1b8b:
        case 0x1b8c:
        case 0x1b8e:
          goto switchD_00190848_caseD_103d;
        case 0x1b83:
          __s = "[VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07043] ";
          break;
        case 0x1b84:
          __s = "[VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07044] ";
          break;
        case 0x1b87:
          __s = "[VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07047] ";
          break;
        case 0x1b89:
          __s = "[VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07049] ";
          break;
        case 0x1b8a:
          __s = "[VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07050] ";
          break;
        case 0x1b8d:
          __s = "[VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07053] ";
          break;
        case 0x1b8f:
          __s = "[VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07055] ";
          break;
        case 0x1b90:
          __s = "[VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07056] ";
          break;
        default:
          switch(id) {
          case 0x1a0f:
            __s = "[VUID-StandaloneSpirv-OpTypeSampledImage-06671] ";
            break;
          case 0x1a10:
            __s = "[VUID-StandaloneSpirv-Location-06672] ";
            break;
          case 0x1a11:
            __s = "[VUID-StandaloneSpirv-OpVariable-06673] ";
            break;
          case 0x1a12:
            __s = "[VUID-StandaloneSpirv-OpEntryPoint-06674] ";
            break;
          case 0x1a13:
            __s = "[VUID-StandaloneSpirv-PushConstant-06675] ";
            break;
          case 0x1a14:
            __s = "[VUID-StandaloneSpirv-Uniform-06676] ";
            break;
          case 0x1a15:
            __s = "[VUID-StandaloneSpirv-UniformConstant-06677] ";
            break;
          case 0x1a16:
            __s = "[VUID-StandaloneSpirv-InputAttachmentIndex-06678] ";
            break;
          default:
            if (id == 0x1839) {
              __s = "[VUID-StandaloneSpirv-Flat-06201] ";
              break;
            }
            if (id == 0x183a) {
              __s = "[VUID-StandaloneSpirv-Flat-06202] ";
              break;
            }
            if (id == 0x1846) {
              __s = "[VUID-StandaloneSpirv-OpTypeImage-06214] ";
              break;
            }
            if (id == 0x191a) {
              __s = "[VUID-StandaloneSpirv-LocalSize-06426] ";
              break;
            }
            if (id == 0x195b) {
              __s = "[VUID-StandaloneSpirv-DescriptorSet-06491] ";
              break;
            }
            if (id == 0x1a4f) {
              __s = "[VUID-CullMaskKHR-CullMaskKHR-06735] ";
              break;
            }
            if (id == 0x1a50) {
              __s = "[VUID-CullMaskKHR-CullMaskKHR-06736] ";
              break;
            }
            if (id == 0x1a51) {
              __s = "[VUID-CullMaskKHR-CullMaskKHR-06737] ";
              break;
            }
            if (id == 0x1a79) {
              __s = "[VUID-StandaloneSpirv-PerVertexKHR-06777] ";
              break;
            }
            if (id == 0x1a7a) {
              __s = "[VUID-StandaloneSpirv-Input-06778] ";
              break;
            }
            if (id == 0x1a97) {
              __s = "[VUID-StandaloneSpirv-Uniform-06807] ";
              break;
            }
            if (id == 0x1a98) {
              __s = "[VUID-StandaloneSpirv-PushConstant-06808] ";
              break;
            }
            if (id == 0x1b0c) {
              __s = "[VUID-StandaloneSpirv-OpTypeImage-06924] ";
              break;
            }
            if (id == 0x1b0d) {
              __s = "[VUID-StandaloneSpirv-Uniform-06925] ";
              break;
            }
            if (id == 0x1bbe) {
              __s = "[VUID-StandaloneSpirv-MeshEXT-07102] ";
              break;
            }
            if (id == 0x1bcf) {
              __s = "[VUID-StandaloneSpirv-ShaderRecordBufferKHR-07119] ";
              break;
            }
            if (id == 0x1c7a) {
              __s = "[VUID-StandaloneSpirv-Input-07290] ";
              break;
            }
            if (id == 0x1c98) {
              __s = "[VUID-StandaloneSpirv-ExecutionModel-07320] ";
              break;
            }
            if (id == 0x1c99) {
              __s = "[VUID-StandaloneSpirv-None-07321] ";
              break;
            }
            if (id == 0x1de2) {
              __s = "[VUID-StandaloneSpirv-Base-07650] ";
              break;
            }
            if (id == 0x1de3) {
              __s = "[VUID-StandaloneSpirv-Base-07651] ";
              break;
            }
            if (id == 0x1de4) {
              __s = "[VUID-StandaloneSpirv-Base-07652] ";
              break;
            }
            if (id == 0x1e17) {
              __s = "[VUID-StandaloneSpirv-Component-07703] ";
              break;
            }
            if (id == 0x1f0f) {
              __s = "[VUID-StandaloneSpirv-SubgroupVoteKHR-07951] ";
              break;
            }
            if (id == 0x2211) {
              __s = "[VUID-StandaloneSpirv-OpEntryPoint-08721] ";
              break;
            }
            if (id == 0x2212) {
              __s = "[VUID-StandaloneSpirv-OpEntryPoint-08722] ";
              break;
            }
            if (id == 0x230d) {
              __s = "[VUID-StandaloneSpirv-Pointer-08973] ";
              break;
            }
            if (id == 0x25a6) {
              __s = "[VUID-StandaloneSpirv-OpTypeImage-09638] ";
              break;
            }
            if (id == 0x25ba) {
              __s = "[VUID-StandaloneSpirv-OpEntryPoint-09658] ";
              break;
            }
            if (id == 0x25bb) {
              __s = "[VUID-StandaloneSpirv-OpEntryPoint-09659] ";
              break;
            }
            goto switchD_00190848_caseD_103d;
          }
        }
      }
    }
  }
  else {
switchD_00190848_caseD_103d:
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_11)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string ValidationState_t::VkErrorID(uint32_t id,
                                         const char* /*reference*/) const {
  if (!spvIsVulkanEnv(context_->target_env)) {
    return "";
  }

  // This large switch case is only searched when an error has occurred.
  // If an id is changed, the old case must be modified or removed. Each string
  // here is interpreted as being "implemented"

  // Clang format adds spaces between hyphens
  // clang-format off
  switch (id) {
    case 4154:
      return VUID_WRAP(VUID-BaryCoordKHR-BaryCoordKHR-04154);
    case 4155:
      return VUID_WRAP(VUID-BaryCoordKHR-BaryCoordKHR-04155);
    case 4156:
      return VUID_WRAP(VUID-BaryCoordKHR-BaryCoordKHR-04156);
    case 4160:
      return VUID_WRAP(VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04160);
    case 4161:
      return VUID_WRAP(VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04161);
    case 4162:
      return VUID_WRAP(VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04162);
    case 4181:
      return VUID_WRAP(VUID-BaseInstance-BaseInstance-04181);
    case 4182:
      return VUID_WRAP(VUID-BaseInstance-BaseInstance-04182);
    case 4183:
      return VUID_WRAP(VUID-BaseInstance-BaseInstance-04183);
    case 4184:
      return VUID_WRAP(VUID-BaseVertex-BaseVertex-04184);
    case 4185:
      return VUID_WRAP(VUID-BaseVertex-BaseVertex-04185);
    case 4186:
      return VUID_WRAP(VUID-BaseVertex-BaseVertex-04186);
    case 4187:
      return VUID_WRAP(VUID-ClipDistance-ClipDistance-04187);
    case 4188:
      return VUID_WRAP(VUID-ClipDistance-ClipDistance-04188);
    case 4189:
      return VUID_WRAP(VUID-ClipDistance-ClipDistance-04189);
    case 4190:
      return VUID_WRAP(VUID-ClipDistance-ClipDistance-04190);
    case 4191:
      return VUID_WRAP(VUID-ClipDistance-ClipDistance-04191);
    case 4196:
      return VUID_WRAP(VUID-CullDistance-CullDistance-04196);
    case 4197:
      return VUID_WRAP(VUID-CullDistance-CullDistance-04197);
    case 4198:
      return VUID_WRAP(VUID-CullDistance-CullDistance-04198);
    case 4199:
      return VUID_WRAP(VUID-CullDistance-CullDistance-04199);
    case 4200:
      return VUID_WRAP(VUID-CullDistance-CullDistance-04200);
    case 6735:
      return VUID_WRAP(VUID-CullMaskKHR-CullMaskKHR-06735); // Execution Model
    case 6736:
      return VUID_WRAP(VUID-CullMaskKHR-CullMaskKHR-06736); // input storage
    case 6737:
      return VUID_WRAP(VUID-CullMaskKHR-CullMaskKHR-06737); // 32 int scalar
    case 4205:
      return VUID_WRAP(VUID-DeviceIndex-DeviceIndex-04205);
    case 4206:
      return VUID_WRAP(VUID-DeviceIndex-DeviceIndex-04206);
    case 4207:
      return VUID_WRAP(VUID-DrawIndex-DrawIndex-04207);
    case 4208:
      return VUID_WRAP(VUID-DrawIndex-DrawIndex-04208);
    case 4209:
      return VUID_WRAP(VUID-DrawIndex-DrawIndex-04209);
    case 4210:
      return VUID_WRAP(VUID-FragCoord-FragCoord-04210);
    case 4211:
      return VUID_WRAP(VUID-FragCoord-FragCoord-04211);
    case 4212:
      return VUID_WRAP(VUID-FragCoord-FragCoord-04212);
    case 4213:
      return VUID_WRAP(VUID-FragDepth-FragDepth-04213);
    case 4214:
      return VUID_WRAP(VUID-FragDepth-FragDepth-04214);
    case 4215:
      return VUID_WRAP(VUID-FragDepth-FragDepth-04215);
    case 4216:
      return VUID_WRAP(VUID-FragDepth-FragDepth-04216);
    case 4217:
      return VUID_WRAP(VUID-FragInvocationCountEXT-FragInvocationCountEXT-04217);
    case 4218:
      return VUID_WRAP(VUID-FragInvocationCountEXT-FragInvocationCountEXT-04218);
    case 4219:
      return VUID_WRAP(VUID-FragInvocationCountEXT-FragInvocationCountEXT-04219);
    case 4220:
      return VUID_WRAP(VUID-FragSizeEXT-FragSizeEXT-04220);
    case 4221:
      return VUID_WRAP(VUID-FragSizeEXT-FragSizeEXT-04221);
    case 4222:
      return VUID_WRAP(VUID-FragSizeEXT-FragSizeEXT-04222);
    case 4223:
      return VUID_WRAP(VUID-FragStencilRefEXT-FragStencilRefEXT-04223);
    case 4224:
      return VUID_WRAP(VUID-FragStencilRefEXT-FragStencilRefEXT-04224);
    case 4225:
      return VUID_WRAP(VUID-FragStencilRefEXT-FragStencilRefEXT-04225);
    case 4229:
      return VUID_WRAP(VUID-FrontFacing-FrontFacing-04229);
    case 4230:
      return VUID_WRAP(VUID-FrontFacing-FrontFacing-04230);
    case 4231:
      return VUID_WRAP(VUID-FrontFacing-FrontFacing-04231);
    case 4232:
      return VUID_WRAP(VUID-FullyCoveredEXT-FullyCoveredEXT-04232);
    case 4233:
      return VUID_WRAP(VUID-FullyCoveredEXT-FullyCoveredEXT-04233);
    case 4234:
      return VUID_WRAP(VUID-FullyCoveredEXT-FullyCoveredEXT-04234);
    case 4236:
      return VUID_WRAP(VUID-GlobalInvocationId-GlobalInvocationId-04236);
    case 4237:
      return VUID_WRAP(VUID-GlobalInvocationId-GlobalInvocationId-04237);
    case 4238:
      return VUID_WRAP(VUID-GlobalInvocationId-GlobalInvocationId-04238);
    case 4239:
      return VUID_WRAP(VUID-HelperInvocation-HelperInvocation-04239);
    case 4240:
      return VUID_WRAP(VUID-HelperInvocation-HelperInvocation-04240);
    case 4241:
      return VUID_WRAP(VUID-HelperInvocation-HelperInvocation-04241);
    case 4242:
      return VUID_WRAP(VUID-HitKindKHR-HitKindKHR-04242);
    case 4243:
      return VUID_WRAP(VUID-HitKindKHR-HitKindKHR-04243);
    case 4244:
      return VUID_WRAP(VUID-HitKindKHR-HitKindKHR-04244);
    case 4245:
      return VUID_WRAP(VUID-HitTNV-HitTNV-04245);
    case 4246:
      return VUID_WRAP(VUID-HitTNV-HitTNV-04246);
    case 4247:
      return VUID_WRAP(VUID-HitTNV-HitTNV-04247);
    case 4248:
      return VUID_WRAP(VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04248);
    case 4249:
      return VUID_WRAP(VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04249);
    case 4250:
      return VUID_WRAP(VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04250);
    case 4251:
      return VUID_WRAP(VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04251);
    case 4252:
      return VUID_WRAP(VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04252);
    case 4253:
      return VUID_WRAP(VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04253);
    case 4254:
      return VUID_WRAP(VUID-InstanceId-InstanceId-04254);
    case 4255:
      return VUID_WRAP(VUID-InstanceId-InstanceId-04255);
    case 4256:
      return VUID_WRAP(VUID-InstanceId-InstanceId-04256);
    case 4257:
      return VUID_WRAP(VUID-InvocationId-InvocationId-04257);
    case 4258:
      return VUID_WRAP(VUID-InvocationId-InvocationId-04258);
    case 4259:
      return VUID_WRAP(VUID-InvocationId-InvocationId-04259);
    case 4263:
      return VUID_WRAP(VUID-InstanceIndex-InstanceIndex-04263);
    case 4264:
      return VUID_WRAP(VUID-InstanceIndex-InstanceIndex-04264);
    case 4265:
      return VUID_WRAP(VUID-InstanceIndex-InstanceIndex-04265);
    case 4266:
      return VUID_WRAP(VUID-LaunchIdKHR-LaunchIdKHR-04266);
    case 4267:
      return VUID_WRAP(VUID-LaunchIdKHR-LaunchIdKHR-04267);
    case 4268:
      return VUID_WRAP(VUID-LaunchIdKHR-LaunchIdKHR-04268);
    case 4269:
      return VUID_WRAP(VUID-LaunchSizeKHR-LaunchSizeKHR-04269);
    case 4270:
      return VUID_WRAP(VUID-LaunchSizeKHR-LaunchSizeKHR-04270);
    case 4271:
      return VUID_WRAP(VUID-LaunchSizeKHR-LaunchSizeKHR-04271);
    case 4272:
      return VUID_WRAP(VUID-Layer-Layer-04272);
    case 4273:
      return VUID_WRAP(VUID-Layer-Layer-04273);
    case 4274:
      return VUID_WRAP(VUID-Layer-Layer-04274);
    case 4275:
      return VUID_WRAP(VUID-Layer-Layer-04275);
    case 4276:
      return VUID_WRAP(VUID-Layer-Layer-04276);
    case 4281:
      return VUID_WRAP(VUID-LocalInvocationId-LocalInvocationId-04281);
    case 4282:
      return VUID_WRAP(VUID-LocalInvocationId-LocalInvocationId-04282);
    case 4283:
      return VUID_WRAP(VUID-LocalInvocationId-LocalInvocationId-04283);
    case 4293:
      return VUID_WRAP(VUID-NumSubgroups-NumSubgroups-04293);
    case 4294:
      return VUID_WRAP(VUID-NumSubgroups-NumSubgroups-04294);
    case 4295:
      return VUID_WRAP(VUID-NumSubgroups-NumSubgroups-04295);
    case 4296:
      return VUID_WRAP(VUID-NumWorkgroups-NumWorkgroups-04296);
    case 4297:
      return VUID_WRAP(VUID-NumWorkgroups-NumWorkgroups-04297);
    case 4298:
      return VUID_WRAP(VUID-NumWorkgroups-NumWorkgroups-04298);
    case 4299:
      return VUID_WRAP(VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04299);
    case 4300:
      return VUID_WRAP(VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04300);
    case 4301:
      return VUID_WRAP(VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04301);
    case 4302:
      return VUID_WRAP(VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04302);
    case 4303:
      return VUID_WRAP(VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04303);
    case 4304:
      return VUID_WRAP(VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04304);
    case 4305:
      return VUID_WRAP(VUID-ObjectToWorldKHR-ObjectToWorldKHR-04305);
    case 4306:
      return VUID_WRAP(VUID-ObjectToWorldKHR-ObjectToWorldKHR-04306);
    case 4307:
      return VUID_WRAP(VUID-ObjectToWorldKHR-ObjectToWorldKHR-04307);
    case 4308:
      return VUID_WRAP(VUID-PatchVertices-PatchVertices-04308);
    case 4309:
      return VUID_WRAP(VUID-PatchVertices-PatchVertices-04309);
    case 4310:
      return VUID_WRAP(VUID-PatchVertices-PatchVertices-04310);
    case 4311:
      return VUID_WRAP(VUID-PointCoord-PointCoord-04311);
    case 4312:
      return VUID_WRAP(VUID-PointCoord-PointCoord-04312);
    case 4313:
      return VUID_WRAP(VUID-PointCoord-PointCoord-04313);
    case 4314:
      return VUID_WRAP(VUID-PointSize-PointSize-04314);
    case 4315:
      return VUID_WRAP(VUID-PointSize-PointSize-04315);
    case 4316:
      return VUID_WRAP(VUID-PointSize-PointSize-04316);
    case 4317:
      return VUID_WRAP(VUID-PointSize-PointSize-04317);
    case 4318:
      return VUID_WRAP(VUID-Position-Position-04318);
    case 4319:
      return VUID_WRAP(VUID-Position-Position-04319);
    case 4320:
      return VUID_WRAP(VUID-Position-Position-04320);
    case 4321:
      return VUID_WRAP(VUID-Position-Position-04321);
    case 4330:
      return VUID_WRAP(VUID-PrimitiveId-PrimitiveId-04330);
    case 4334:
      return VUID_WRAP(VUID-PrimitiveId-PrimitiveId-04334);
    case 4337:
      return VUID_WRAP(VUID-PrimitiveId-PrimitiveId-04337);
    case 4345:
      return VUID_WRAP(VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04345);
    case 4346:
      return VUID_WRAP(VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04346);
    case 4347:
      return VUID_WRAP(VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04347);
    case 4348:
      return VUID_WRAP(VUID-RayTmaxKHR-RayTmaxKHR-04348);
    case 4349:
      return VUID_WRAP(VUID-RayTmaxKHR-RayTmaxKHR-04349);
    case 4350:
      return VUID_WRAP(VUID-RayTmaxKHR-RayTmaxKHR-04350);
    case 4351:
      return VUID_WRAP(VUID-RayTminKHR-RayTminKHR-04351);
    case 4352:
      return VUID_WRAP(VUID-RayTminKHR-RayTminKHR-04352);
    case 4353:
      return VUID_WRAP(VUID-RayTminKHR-RayTminKHR-04353);
    case 4354:
      return VUID_WRAP(VUID-SampleId-SampleId-04354);
    case 4355:
      return VUID_WRAP(VUID-SampleId-SampleId-04355);
    case 4356:
      return VUID_WRAP(VUID-SampleId-SampleId-04356);
    case 4357:
      return VUID_WRAP(VUID-SampleMask-SampleMask-04357);
    case 4358:
      return VUID_WRAP(VUID-SampleMask-SampleMask-04358);
    case 4359:
      return VUID_WRAP(VUID-SampleMask-SampleMask-04359);
    case 4360:
      return VUID_WRAP(VUID-SamplePosition-SamplePosition-04360);
    case 4361:
      return VUID_WRAP(VUID-SamplePosition-SamplePosition-04361);
    case 4362:
      return VUID_WRAP(VUID-SamplePosition-SamplePosition-04362);
    case 4367:
      return VUID_WRAP(VUID-SubgroupId-SubgroupId-04367);
    case 4368:
      return VUID_WRAP(VUID-SubgroupId-SubgroupId-04368);
    case 4369:
      return VUID_WRAP(VUID-SubgroupId-SubgroupId-04369);
    case 4370:
      return VUID_WRAP(VUID-SubgroupEqMask-SubgroupEqMask-04370);
    case 4371:
      return VUID_WRAP(VUID-SubgroupEqMask-SubgroupEqMask-04371);
    case 4372:
      return VUID_WRAP(VUID-SubgroupGeMask-SubgroupGeMask-04372);
    case 4373:
      return VUID_WRAP(VUID-SubgroupGeMask-SubgroupGeMask-04373);
    case 4374:
      return VUID_WRAP(VUID-SubgroupGtMask-SubgroupGtMask-04374);
    case 4375:
      return VUID_WRAP(VUID-SubgroupGtMask-SubgroupGtMask-04375);
    case 4376:
      return VUID_WRAP(VUID-SubgroupLeMask-SubgroupLeMask-04376);
    case 4377:
      return VUID_WRAP(VUID-SubgroupLeMask-SubgroupLeMask-04377);
    case 4378:
      return VUID_WRAP(VUID-SubgroupLtMask-SubgroupLtMask-04378);
    case 4379:
      return VUID_WRAP(VUID-SubgroupLtMask-SubgroupLtMask-04379);
    case 4380:
      return VUID_WRAP(VUID-SubgroupLocalInvocationId-SubgroupLocalInvocationId-04380);
    case 4381:
      return VUID_WRAP(VUID-SubgroupLocalInvocationId-SubgroupLocalInvocationId-04381);
    case 4382:
      return VUID_WRAP(VUID-SubgroupSize-SubgroupSize-04382);
    case 4383:
      return VUID_WRAP(VUID-SubgroupSize-SubgroupSize-04383);
    case 4387:
      return VUID_WRAP(VUID-TessCoord-TessCoord-04387);
    case 4388:
      return VUID_WRAP(VUID-TessCoord-TessCoord-04388);
    case 4389:
      return VUID_WRAP(VUID-TessCoord-TessCoord-04389);
    case 4390:
      return VUID_WRAP(VUID-TessLevelOuter-TessLevelOuter-04390);
    case 4391:
      return VUID_WRAP(VUID-TessLevelOuter-TessLevelOuter-04391);
    case 4392:
      return VUID_WRAP(VUID-TessLevelOuter-TessLevelOuter-04392);
    case 4393:
      return VUID_WRAP(VUID-TessLevelOuter-TessLevelOuter-04393);
    case 4394:
      return VUID_WRAP(VUID-TessLevelInner-TessLevelInner-04394);
    case 4395:
      return VUID_WRAP(VUID-TessLevelInner-TessLevelInner-04395);
    case 4396:
      return VUID_WRAP(VUID-TessLevelInner-TessLevelInner-04396);
    case 4397:
      return VUID_WRAP(VUID-TessLevelInner-TessLevelInner-04397);
    case 4398:
      return VUID_WRAP(VUID-VertexIndex-VertexIndex-04398);
    case 4399:
      return VUID_WRAP(VUID-VertexIndex-VertexIndex-04399);
    case 4400:
      return VUID_WRAP(VUID-VertexIndex-VertexIndex-04400);
    case 4401:
      return VUID_WRAP(VUID-ViewIndex-ViewIndex-04401);
    case 4402:
      return VUID_WRAP(VUID-ViewIndex-ViewIndex-04402);
    case 4403:
      return VUID_WRAP(VUID-ViewIndex-ViewIndex-04403);
    case 4404:
      return VUID_WRAP(VUID-ViewportIndex-ViewportIndex-04404);
    case 4405:
      return VUID_WRAP(VUID-ViewportIndex-ViewportIndex-04405);
    case 4406:
      return VUID_WRAP(VUID-ViewportIndex-ViewportIndex-04406);
    case 4407:
      return VUID_WRAP(VUID-ViewportIndex-ViewportIndex-04407);
    case 4408:
      return VUID_WRAP(VUID-ViewportIndex-ViewportIndex-04408);
    case 4422:
      return VUID_WRAP(VUID-WorkgroupId-WorkgroupId-04422);
    case 4423:
      return VUID_WRAP(VUID-WorkgroupId-WorkgroupId-04423);
    case 4424:
      return VUID_WRAP(VUID-WorkgroupId-WorkgroupId-04424);
    case 4425:
      return VUID_WRAP(VUID-WorkgroupSize-WorkgroupSize-04425);
    case 4426:
      return VUID_WRAP(VUID-WorkgroupSize-WorkgroupSize-04426);
    case 4427:
      return VUID_WRAP(VUID-WorkgroupSize-WorkgroupSize-04427);
    case 4428:
      return VUID_WRAP(VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04428);
    case 4429:
      return VUID_WRAP(VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04429);
    case 4430:
      return VUID_WRAP(VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04430);
    case 4431:
      return VUID_WRAP(VUID-WorldRayOriginKHR-WorldRayOriginKHR-04431);
    case 4432:
      return VUID_WRAP(VUID-WorldRayOriginKHR-WorldRayOriginKHR-04432);
    case 4433:
      return VUID_WRAP(VUID-WorldRayOriginKHR-WorldRayOriginKHR-04433);
    case 4434:
      return VUID_WRAP(VUID-WorldToObjectKHR-WorldToObjectKHR-04434);
    case 4435:
      return VUID_WRAP(VUID-WorldToObjectKHR-WorldToObjectKHR-04435);
    case 4436:
      return VUID_WRAP(VUID-WorldToObjectKHR-WorldToObjectKHR-04436);
    case 4484:
      return VUID_WRAP(VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04484);
    case 4485:
      return VUID_WRAP(VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04485);
    case 4486:
      return VUID_WRAP(VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04486);
    case 4490:
      return VUID_WRAP(VUID-ShadingRateKHR-ShadingRateKHR-04490);
    case 4491:
      return VUID_WRAP(VUID-ShadingRateKHR-ShadingRateKHR-04491);
    case 4492:
      return VUID_WRAP(VUID-ShadingRateKHR-ShadingRateKHR-04492);
    case 4633:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04633);
    case 4634:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04634);
    case 4635:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04635);
    case 4636:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04636);
    case 4637:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04637);
    case 4638:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04638);
    case 7321:
      return VUID_WRAP(VUID-StandaloneSpirv-None-07321);
    case 4640:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04640);
    case 4641:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04641);
    case 4642:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04642);
    case 4643:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04643);
    case 4644:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04644);
    case 4645:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04645);
    case 4650:
      return VUID_WRAP(VUID-StandaloneSpirv-OpControlBarrier-04650);
    case 4651:
      return VUID_WRAP(VUID-StandaloneSpirv-OpVariable-04651);
    case 4652:
      return VUID_WRAP(VUID-StandaloneSpirv-OpReadClockKHR-04652);
    case 4653:
      return VUID_WRAP(VUID-StandaloneSpirv-OriginLowerLeft-04653);
    case 4654:
      return VUID_WRAP(VUID-StandaloneSpirv-PixelCenterInteger-04654);
    case 4655:
      return VUID_WRAP(VUID-StandaloneSpirv-UniformConstant-04655);
    case 4656:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeImage-04656);
    case 4657:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeImage-04657);
    case 4658:
      return VUID_WRAP(VUID-StandaloneSpirv-OpImageTexelPointer-04658);
    case 4659:
      return VUID_WRAP(VUID-StandaloneSpirv-OpImageQuerySizeLod-04659);
    case 4663:
      return VUID_WRAP(VUID-StandaloneSpirv-Offset-04663);
    case 4664:
      return VUID_WRAP(VUID-StandaloneSpirv-OpImageGather-04664);
    case 4667:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04667);
    case 4669:
      return VUID_WRAP(VUID-StandaloneSpirv-GLSLShared-04669);
    case 4670:
      return VUID_WRAP(VUID-StandaloneSpirv-Flat-04670);
    case 4675:
      return VUID_WRAP(VUID-StandaloneSpirv-FPRoundingMode-04675);
    case 4677:
      return VUID_WRAP(VUID-StandaloneSpirv-Invariant-04677);
    case 4680:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeRuntimeArray-04680);
    case 4682:
      return VUID_WRAP(VUID-StandaloneSpirv-OpControlBarrier-04682);
    case 6426:
      return VUID_WRAP(VUID-StandaloneSpirv-LocalSize-06426); // formally 04683
    case 4685:
      return VUID_WRAP(VUID-StandaloneSpirv-OpGroupNonUniformBallotBitCount-04685);
    case 4686:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04686);
    case 4698:
      return VUID_WRAP(VUID-StandaloneSpirv-RayPayloadKHR-04698);
    case 4699:
      return VUID_WRAP(VUID-StandaloneSpirv-IncomingRayPayloadKHR-04699);
    case 4700:
      return VUID_WRAP(VUID-StandaloneSpirv-IncomingRayPayloadKHR-04700);
    case 4701:
      return VUID_WRAP(VUID-StandaloneSpirv-HitAttributeKHR-04701);
    case 4702:
      return VUID_WRAP(VUID-StandaloneSpirv-HitAttributeKHR-04702);
    case 4703:
      return VUID_WRAP(VUID-StandaloneSpirv-HitAttributeKHR-04703);
    case 4704:
      return VUID_WRAP(VUID-StandaloneSpirv-CallableDataKHR-04704);
    case 4705:
      return VUID_WRAP(VUID-StandaloneSpirv-IncomingCallableDataKHR-04705);
    case 4706:
      return VUID_WRAP(VUID-StandaloneSpirv-IncomingCallableDataKHR-04706);
    case 7119:
      return VUID_WRAP(VUID-StandaloneSpirv-ShaderRecordBufferKHR-07119);
    case 4708:
      return VUID_WRAP(VUID-StandaloneSpirv-PhysicalStorageBuffer64-04708);
    case 4710:
      return VUID_WRAP(VUID-StandaloneSpirv-PhysicalStorageBuffer64-04710);
    case 4711:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeForwardPointer-04711);
    case 4730:
      return VUID_WRAP(VUID-StandaloneSpirv-OpAtomicStore-04730);
    case 4731:
      return VUID_WRAP(VUID-StandaloneSpirv-OpAtomicLoad-04731);
    case 4732:
      return VUID_WRAP(VUID-StandaloneSpirv-OpMemoryBarrier-04732);
    case 4733:
      return VUID_WRAP(VUID-StandaloneSpirv-OpMemoryBarrier-04733);
    case 4734:
      return VUID_WRAP(VUID-StandaloneSpirv-OpVariable-04734);
    case 4744:
      return VUID_WRAP(VUID-StandaloneSpirv-Flat-04744);
    case 4777:
      return VUID_WRAP(VUID-StandaloneSpirv-OpImage-04777);
    case 4780:
      return VUID_WRAP(VUID-StandaloneSpirv-Result-04780);
    case 4781:
      return VUID_WRAP(VUID-StandaloneSpirv-Base-04781);
    case 4915:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-04915);
    case 4916:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-04916);
    case 4917:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-04917);
    case 4918:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-04918);
    case 4919:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-04919);
    case 4920:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-04920);
    case 4921:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-04921);
    case 4922:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-04922);
    case 4923:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-04923);
    case 4924:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-04924);
    case 6201:
      return VUID_WRAP(VUID-StandaloneSpirv-Flat-06201);
    case 6202:
      return VUID_WRAP(VUID-StandaloneSpirv-Flat-06202);
    case 6214:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeImage-06214);
    case 6491:
      return VUID_WRAP(VUID-StandaloneSpirv-DescriptorSet-06491);
    case 6671:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeSampledImage-06671);
    case 6672:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-06672);
    case 6673:
      return VUID_WRAP(VUID-StandaloneSpirv-OpVariable-06673);
    case 6674:
      return VUID_WRAP(VUID-StandaloneSpirv-OpEntryPoint-06674);
    case 6675:
      return VUID_WRAP(VUID-StandaloneSpirv-PushConstant-06675);
    case 6676:
      return VUID_WRAP(VUID-StandaloneSpirv-Uniform-06676);
    case 6677:
      return VUID_WRAP(VUID-StandaloneSpirv-UniformConstant-06677);
    case 6678:
      return VUID_WRAP(VUID-StandaloneSpirv-InputAttachmentIndex-06678);
    case 6777:
      return VUID_WRAP(VUID-StandaloneSpirv-PerVertexKHR-06777);
    case 6778:
      return VUID_WRAP(VUID-StandaloneSpirv-Input-06778);
    case 6807:
      return VUID_WRAP(VUID-StandaloneSpirv-Uniform-06807);
    case 6808:
      return VUID_WRAP(VUID-StandaloneSpirv-PushConstant-06808);
    case 6924:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeImage-06924);
    case 6925:
      return VUID_WRAP(VUID-StandaloneSpirv-Uniform-06925);
    case 7041:
      return VUID_WRAP(VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07041);
    case 7043:
      return VUID_WRAP(VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07043);
    case 7044:
      return VUID_WRAP(VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07044);
    case 7047:
      return VUID_WRAP(VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07047);
    case 7049:
      return VUID_WRAP(VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07049);
    case 7050:
      return VUID_WRAP(VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07050);
    case 7053:
      return VUID_WRAP(VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07053);
    case 7055:
      return VUID_WRAP(VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07055);
    case 7056:
      return VUID_WRAP(VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07056);
    case 7102:
      return VUID_WRAP(VUID-StandaloneSpirv-MeshEXT-07102);
    case 7320:
      return VUID_WRAP(VUID-StandaloneSpirv-ExecutionModel-07320);
    case 7290:
      return VUID_WRAP(VUID-StandaloneSpirv-Input-07290);
    case 7650:
      return VUID_WRAP(VUID-StandaloneSpirv-Base-07650);
    case 7651:
      return VUID_WRAP(VUID-StandaloneSpirv-Base-07651);
    case 7652:
      return VUID_WRAP(VUID-StandaloneSpirv-Base-07652);
    case 7703:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-07703);
    case 7951:
      return VUID_WRAP(VUID-StandaloneSpirv-SubgroupVoteKHR-07951);
    case 8721:
      return VUID_WRAP(VUID-StandaloneSpirv-OpEntryPoint-08721);
    case 8722:
      return VUID_WRAP(VUID-StandaloneSpirv-OpEntryPoint-08722);
    case 8973:
      return VUID_WRAP(VUID-StandaloneSpirv-Pointer-08973);
    case 9638:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeImage-09638);
    case 9658:
      return VUID_WRAP(VUID-StandaloneSpirv-OpEntryPoint-09658);
    case 9659:
      return VUID_WRAP(VUID-StandaloneSpirv-OpEntryPoint-09659);
    default:
      return "";  // unknown id
  }
  // clang-format on
}